

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

void __thiscall
QHashPrivate::Node<QFontDatabasePrivate::ExtendedScript,QList<QString>>::
emplaceValue<QList<QString>>
          (Node<QFontDatabasePrivate::ExtendedScript,QList<QString>> *this,QList<QString> *args)

{
  long in_FS_OFFSET;
  QArrayDataPointer<QString> local_28;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.d = (args->d).d;
  local_28.ptr = (args->d).ptr;
  (args->d).d = (Data *)0x0;
  (args->d).ptr = (QString *)0x0;
  local_28.size = (args->d).size;
  (args->d).size = 0;
  QArrayDataPointer<QString>::operator=((QArrayDataPointer<QString> *)(this + 8),&local_28);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplaceValue(Args &&... args)
    {
        value = T(std::forward<Args>(args)...);
    }